

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O3

clock_constraint_t __thiscall
tchecker::reference_clock_variables_t::translate
          (reference_clock_variables_t *this,clock_constraint_t *c)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  clock_id_t id1;
  uint uVar4;
  clock_id_t id2;
  ulong uVar5;
  ulong uVar6;
  stored_size_type sVar7;
  clock_constraint_t local_18;
  
  uVar1 = c->_id1;
  uVar6 = (ulong)uVar1;
  if (uVar6 == 0x7fffffff) {
    uVar4 = c->_id2;
    if (uVar4 == 0x7fffffff) {
      __assert_fail("c.id1() != tchecker::REFCLOCK_ID || c.id2() != tchecker::REFCLOCK_ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                    ,0x1b6,
                    "tchecker::clock_constraint_t tchecker::reference_clock_variables_t::translate(const tchecker::clock_constraint_t &) const"
                   );
    }
LAB_00150fff:
    sVar7 = *(stored_size_type *)
             ((long)&(this->super_flat_clock_variables_t).
                     super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._index._key_map.m_flat_tree.m_data + 8);
    if (sVar7 != *(stored_size_type *)
                  ((long)&(this->super_flat_clock_variables_t).
                          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._index._value_map.m_flat_tree.m_data + 8)) goto LAB_001510bd;
    if (sVar7 - this->_refcount <= (ulong)uVar4) {
      __assert_fail("c.id2() == tchecker::REFCLOCK_ID || c.id2() < size() - _refcount",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                    ,0x1b8,
                    "tchecker::clock_constraint_t tchecker::reference_clock_variables_t::translate(const tchecker::clock_constraint_t &) const"
                   );
    }
    if (uVar1 != 0x7fffffff) {
      bVar3 = false;
      goto LAB_00151057;
    }
    sVar7 = *(stored_size_type *)
             ((long)&(this->super_flat_clock_variables_t).
                     super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._index._key_map.m_flat_tree.m_data + 8);
    if (sVar7 != *(stored_size_type *)
                  ((long)&(this->super_flat_clock_variables_t).
                          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._index._value_map.m_flat_tree.m_data + 8)) goto LAB_001510bd;
    uVar5 = (ulong)this->_refcount;
    if (sVar7 - uVar5 <= (ulong)uVar4) goto LAB_0015111a;
    id1 = (this->_refmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[this->_refcount + uVar4];
  }
  else {
    sVar7 = *(stored_size_type *)
             ((long)&(this->super_flat_clock_variables_t).
                     super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._index._key_map.m_flat_tree.m_data + 8);
    if (sVar7 != *(stored_size_type *)
                  ((long)&(this->super_flat_clock_variables_t).
                          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._index._value_map.m_flat_tree.m_data + 8)) goto LAB_001510bd;
    if (sVar7 - this->_refcount <= uVar6) {
      __assert_fail("c.id1() == tchecker::REFCLOCK_ID || c.id1() < size() - _refcount",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                    ,0x1b7,
                    "tchecker::clock_constraint_t tchecker::reference_clock_variables_t::translate(const tchecker::clock_constraint_t &) const"
                   );
    }
    uVar4 = c->_id2;
    if (uVar4 != 0x7fffffff) goto LAB_00150fff;
    bVar3 = true;
    uVar4 = 0x7fffffff;
LAB_00151057:
    sVar7 = *(stored_size_type *)
             ((long)&(this->super_flat_clock_variables_t).
                     super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._index._key_map.m_flat_tree.m_data + 8);
    if (sVar7 != *(stored_size_type *)
                  ((long)&(this->super_flat_clock_variables_t).
                          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._index._value_map.m_flat_tree.m_data + 8)) {
LAB_001510bd:
      __assert_fail("_key_map.size() == _value_map.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                    ,0x90,
                    "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                   );
    }
    uVar2 = this->_refcount;
    uVar5 = (ulong)uVar2;
    if (sVar7 - uVar5 <= uVar6) goto LAB_001510dc;
    id1 = uVar2 + uVar1;
    if (bVar3) {
      if (sVar7 - uVar5 <= uVar6) {
LAB_0015111a:
        __assert_fail("id < size() - _refcount",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/variables/clocks.hh"
                      ,0x2b3,
                      "tchecker::clock_id_t tchecker::reference_clock_variables_t::refclock_of_system_clock(tchecker::clock_id_t) const"
                     );
      }
      id2 = (this->_refmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2 + uVar1];
      goto LAB_0015109c;
    }
  }
  if ((ulong)uVar4 < sVar7 - uVar5) {
    id2 = (int)uVar5 + uVar4;
LAB_0015109c:
    clock_constraint_t::clock_constraint_t(&local_18,id1,id2,c->_cmp,c->_value);
    return local_18;
  }
LAB_001510dc:
  __assert_fail("id < size() - _refcount",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/variables/clocks.hh"
                ,0x2a6,
                "tchecker::clock_id_t tchecker::reference_clock_variables_t::translate_system_clock(tchecker::clock_id_t) const"
               );
}

Assistant:

std::string to_string(tchecker::clock_constraint_container_t const & c, tchecker::clock_index_t const & index)
{
  std::stringstream ss;
  tchecker::output_clock_constraints(ss, tchecker::make_range(c.begin(), c.end()), index);
  return ss.str();
}